

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O3

void do_medit(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  int vnum;
  char *pcVar3;
  MOB_INDEX_DATA *pMVar4;
  char *pcVar5;
  AREA_DATA_conflict *pAVar6;
  char *pcVar7;
  char arg1 [4608];
  char local_1228 [4616];
  
  bVar2 = check_security(ch);
  if (!bVar2) {
    return;
  }
  pcVar3 = one_argument(argument,local_1228);
  bVar2 = is_number(local_1228);
  if (bVar2) {
    atoi(local_1228);
    pMVar4 = get_mob_index(0);
    if (pMVar4 == (MOB_INDEX_DATA *)0x0) {
      pcVar3 = "MEdit:  That vnum does not exist.\n\r";
      goto LAB_00354dc9;
    }
    bVar2 = is_switched(ch);
    if (!bVar2) {
      if (pMVar4->area->security < ch->pcdata->security) {
LAB_00354e2c:
        pDVar1 = ch->desc;
        pDVar1->pEdit = pMVar4;
        pDVar1->editor = 4;
        medit_show(ch,"");
        return;
      }
      pcVar3 = pMVar4->area->builders;
      pcVar5 = strstr(pcVar3,ch->name);
      if ((pcVar5 != (char *)0x0) || (pcVar3 = strstr(pcVar3,"All"), pcVar3 != (char *)0x0))
      goto LAB_00354e2c;
    }
  }
  else {
    bVar2 = str_cmp(local_1228,"create");
    if (bVar2) {
      pcVar3 = "MEdit:  There is no default mobile to edit.\n\r";
      goto LAB_00354dc9;
    }
    vnum = atoi(pcVar3);
    if (vnum == 0 || local_1228[0] == '\0') {
      pcVar3 = "Syntax:  edit mobile create [vnum]\n\r";
      goto LAB_00354dc9;
    }
    pAVar6 = get_vnum_area(vnum);
    if (pAVar6 == (AREA_DATA_conflict *)0x0) {
      pcVar3 = "MEdit:  That vnum is not assigned an area.\n\r";
      goto LAB_00354dc9;
    }
    bVar2 = is_switched(ch);
    if (!bVar2) {
      if (pAVar6->security < ch->pcdata->security) {
LAB_00354ec4:
        bVar2 = medit_create(ch,pcVar3);
        if (!bVar2) {
          return;
        }
        *(byte *)pAVar6->area_flags = (byte)pAVar6->area_flags[0] | 8;
        ch->desc->editor = 4;
        return;
      }
      pcVar5 = pAVar6->builders;
      pcVar7 = strstr(pcVar5,ch->name);
      if ((pcVar7 != (char *)0x0) || (pcVar5 = strstr(pcVar5,"All"), pcVar5 != (char *)0x0))
      goto LAB_00354ec4;
    }
  }
  pcVar3 = "Insufficient security to modify mobs.\n\r";
LAB_00354dc9:
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_medit(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	AREA_DATA *pArea;
	int value;
	char arg1[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	if (is_number(arg1))
	{
		value = atoi(arg1);
		if (!(pMob = get_mob_index(value)))
		{
			send_to_char("MEdit:  That vnum does not exist.\n\r", ch);
			return;
		}

		if (!IS_BUILDER(ch, pMob->area))
		{
			send_to_char("Insufficient security to modify mobs.\n\r", ch);
			return;
		}

		ch->desc->pEdit = (void *)pMob;
		ch->desc->editor = ED_MOBILE;

		medit_show(ch, "");
		return;
	}
	else
	{
		if (!str_cmp(arg1, "create"))
		{
			value = atoi(argument);

			if (arg1[0] == '\0' || value == 0)
			{
				send_to_char("Syntax:  edit mobile create [vnum]\n\r", ch);
				return;
			}

			pArea = get_vnum_area(value);

			if (!pArea)
			{
				send_to_char("MEdit:  That vnum is not assigned an area.\n\r", ch);
				return;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("Insufficient security to modify mobs.\n\r", ch);
				return;
			}

			if (medit_create(ch, argument))
			{
				SET_BIT(pArea->area_flags, AREA_CHANGED);
				ch->desc->editor = ED_MOBILE;
			}

			return;
		}
	}

	send_to_char("MEdit:  There is no default mobile to edit.\n\r", ch);
}